

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmarker.c
# Opt level: O2

boolean get_interesting_appn(j_decompress_ptr cinfo)

{
  byte bVar1;
  int iVar2;
  jpeg_source_mgr *pjVar3;
  jpeg_error_mgr *pjVar4;
  boolean bVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  byte *pbVar9;
  size_t sVar10;
  ulong uVar11;
  ulong uVar12;
  JOCTET b [14];
  
  pjVar3 = cinfo->src;
  sVar10 = pjVar3->bytes_in_buffer;
  if (sVar10 == 0) {
    bVar5 = (*pjVar3->fill_input_buffer)(cinfo);
    if (bVar5 != 0) {
      sVar10 = pjVar3->bytes_in_buffer;
      goto LAB_0023661d;
    }
LAB_002366db:
    bVar5 = 0;
  }
  else {
LAB_0023661d:
    bVar1 = *pjVar3->next_input_byte;
    sVar10 = sVar10 - 1;
    if (sVar10 == 0) {
      bVar5 = (*pjVar3->fill_input_buffer)(cinfo);
      if (bVar5 == 0) goto LAB_002366db;
      pbVar9 = pjVar3->next_input_byte;
      sVar10 = pjVar3->bytes_in_buffer;
    }
    else {
      pbVar9 = pjVar3->next_input_byte + 1;
    }
    uVar11 = (ulong)bVar1 * 0x100;
    uVar8 = uVar11 | *pbVar9;
    lVar7 = *pbVar9 + uVar11 + -2;
    uVar11 = 0;
    uVar6 = (uint)lVar7;
    if (uVar8 < 3) {
      uVar6 = 0;
    }
    uVar12 = 0xe;
    if (uVar8 < 0x10) {
      uVar12 = (ulong)uVar6;
    }
    while( true ) {
      pbVar9 = pbVar9 + 1;
      sVar10 = sVar10 - 1;
      if (uVar12 == uVar11) break;
      if (sVar10 == 0) {
        bVar5 = (*pjVar3->fill_input_buffer)(cinfo);
        if (bVar5 == 0) goto LAB_002366db;
        pbVar9 = pjVar3->next_input_byte;
        sVar10 = pjVar3->bytes_in_buffer;
      }
      b[uVar11] = *pbVar9;
      uVar11 = uVar11 + 1;
    }
    lVar7 = lVar7 - uVar12;
    iVar2 = cinfo->unread_marker;
    if (iVar2 == 0xee) {
      examine_app14(cinfo,b,(uint)uVar12,lVar7);
    }
    else if (iVar2 == 0xe0) {
      examine_app0(cinfo,b,(uint)uVar12,lVar7);
    }
    else {
      pjVar4 = cinfo->err;
      pjVar4->msg_code = 0x46;
      (pjVar4->msg_parm).i[0] = iVar2;
      (*cinfo->err->error_exit)((j_common_ptr)cinfo);
    }
    pjVar3->next_input_byte = pbVar9;
    pjVar3->bytes_in_buffer = sVar10;
    bVar5 = 1;
    if (0 < lVar7) {
      (*cinfo->src->skip_input_data)(cinfo,lVar7);
    }
  }
  return bVar5;
}

Assistant:

METHODDEF(boolean)
get_interesting_appn (j_decompress_ptr cinfo)
/* Process an APP0 or APP14 marker without saving it */
{
  INT32 length;
  JOCTET b[APPN_DATA_LEN];
  unsigned int i, numtoread;
  INPUT_VARS(cinfo);

  INPUT_2BYTES(cinfo, length, return FALSE);
  length -= 2;

  /* get the interesting part of the marker data */
  if (length >= APPN_DATA_LEN)
    numtoread = APPN_DATA_LEN;
  else if (length > 0)
    numtoread = (unsigned int) length;
  else
    numtoread = 0;
  for (i = 0; i < numtoread; i++)
    INPUT_BYTE(cinfo, b[i], return FALSE);
  length -= numtoread;

  /* process it */
  switch (cinfo->unread_marker) {
  case M_APP0:
    examine_app0(cinfo, (JOCTET FAR *) b, numtoread, length);
    break;
  case M_APP14:
    examine_app14(cinfo, (JOCTET FAR *) b, numtoread, length);
    break;
  default:
    /* can't get here unless jpeg_save_markers chooses wrong processor */
    ERREXIT1(cinfo, JERR_UNKNOWN_MARKER, cinfo->unread_marker);
    break;
  }

  /* skip any remaining data -- could be lots */
  INPUT_SYNC(cinfo);
  if (length > 0)
    (*cinfo->src->skip_input_data) (cinfo, (long) length);

  return TRUE;
}